

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosXMLUtil.cpp
# Opt level: O3

unique_ptr<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>_>
adios2::helper::XMLAttribute(string *attributeName,xml_node *node,string hint,bool isMandatory)

{
  pointer pcVar1;
  xml_attribute xVar2;
  undefined7 in_register_00000011;
  
  pcVar1 = (pointer)operator_new(8);
  xVar2 = pugi::xml_node::attribute
                    ((xml_node *)CONCAT71(in_register_00000011,isMandatory),(char_t *)node->_root);
  *(xml_attribute_struct **)pcVar1 = xVar2._attr;
  (attributeName->_M_dataplus)._M_p = pcVar1;
  return (__uniq_ptr_data<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>,_true,_true>
         )(__uniq_ptr_data<pugi::xml_attribute,_std::default_delete<pugi::xml_attribute>,_true,_true>
           )attributeName;
}

Assistant:

std::unique_ptr<pugi::xml_attribute> XMLAttribute(const std::string attributeName,
                                                  const pugi::xml_node &node,
                                                  const std::string hint, const bool isMandatory)
{
    std::unique_ptr<pugi::xml_attribute> attribute(
        new pugi::xml_attribute(node.attribute(attributeName.c_str())));

    if (isMandatory && !attribute)
    {
        const std::string nodeName(node.name());

        helper::Throw<std::invalid_argument>("Helper", "adiosXMLUtil", "XMLAttribute",
                                             "No attribute " + attributeName + " found on <" +
                                                 nodeName + "> element" + hint);
    }
    return attribute;
}